

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O1

ps_alignment_iter_t * ps_alignment_iter_goto(ps_alignment_iter_t *itor,int pos)

{
  if (itor == (ps_alignment_iter_t *)0x0) {
    itor = (ps_alignment_iter_t *)0x0;
  }
  else if (pos < (int)(uint)itor->vec->n_ent) {
    itor->pos = pos;
    if (itor->parent != -1) {
      itor->parent = itor->vec->seq[pos].parent;
    }
  }
  else {
    ps_alignment_iter_free(itor);
    itor = (ps_alignment_iter_t *)0x0;
  }
  return itor;
}

Assistant:

ps_alignment_iter_t *
ps_alignment_iter_goto(ps_alignment_iter_t *itor, int pos)
{
    if (itor == NULL)
        return NULL;
    if (pos >= itor->vec->n_ent) {
        ps_alignment_iter_free(itor);
        return NULL;
    }
    itor->pos = pos;
    /* Switch to this word/phone as parent */
    if (itor->parent != PS_ALIGNMENT_NONE)
        itor->parent = itor->vec->seq[itor->pos].parent;
    return itor;
}